

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O3

Am_Wrapper * name_from_value_proc(Am_Object *self)

{
  Am_Value *pAVar1;
  char *__src;
  ostream *poVar2;
  size_t sVar3;
  Am_Wrapper *pAVar4;
  Am_Value value;
  Am_String AStack_28;
  Am_Value local_20;
  
  local_20.type = 0;
  local_20.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)self,0x169);
  Am_Value::operator=(&local_20,pAVar1);
  builtin_strncpy(name_from_value_proc::outs,"Color to ",10);
  if (local_20.type == 0x8008) {
    Am_String::Am_String(&AStack_28,&local_20);
    __src = Am_String::operator_cast_to_char_(&AStack_28);
    strcat(name_from_value_proc::outs,__src);
    Am_String::~Am_String(&AStack_28);
  }
  else {
    sVar3 = strlen(name_from_value_proc::outs);
    builtin_strncpy(name_from_value_proc::outs + sVar3,"Whit",4);
    (name_from_value_proc::outs + sVar3 + 4)[0] = 'e';
    (name_from_value_proc::outs + sVar3 + 4)[1] = '\0';
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"new name for ",0xd);
  poVar2 = (ostream *)operator<<((ostream *)&std::cout,self);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is `",5);
  sVar3 = strlen(name_from_value_proc::outs);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,name_from_value_proc::outs,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'\n",2);
  std::ostream::flush();
  Am_String::Am_String(&AStack_28,name_from_value_proc::outs,true);
  pAVar4 = Am_String::operator_cast_to_Am_Wrapper_(&AStack_28);
  Am_String::~Am_String(&AStack_28);
  Am_Value::~Am_Value(&local_20);
  return pAVar4;
}

Assistant:

Am_Define_String_Formula(name_from_value)
{
  Am_Value value;
  value = self.Peek(Am_VALUE);
  static char outs[MAXNAMESIZE];
  strcpy(outs, COLORSTR);
  //concatenate current color on end
  if (value.type == Am_STRING) {
    strcat(outs, Am_String(value));
  } else
    strcat(outs, DEFAULTSTR);
  std::cout << "new name for " << self << " is `" << outs << "'\n"
            << std::flush;
  return Am_String(outs);
}